

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O3

CBString * __thiscall TreeItem::data(CBString *__return_storage_ptr__,TreeItem *this,int column)

{
  CBString *b;
  
  switch(column) {
  case 0:
    b = &this->itemName;
    goto LAB_0012cdd5;
  case 1:
    actionTypeToUString(__return_storage_ptr__,this->itemAction);
    break;
  case 2:
    itemTypeToUString(__return_storage_ptr__,this->itemType);
    break;
  case 3:
    itemSubtypeToUString(__return_storage_ptr__,this->itemType,this->itemSubtype);
    break;
  case 4:
    b = &this->itemText;
LAB_0012cdd5:
    Bstrlib::CBString::CBString(__return_storage_ptr__,b);
    break;
  default:
    Bstrlib::CBString::CBString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UString TreeItem::data(int column) const
{
    switch (column)
    {
        case 0: // Name
            return itemName;
        case 1: // Action
            return actionTypeToUString(itemAction);
        case 2: // Type
            return itemTypeToUString(itemType);
        case 3: // Subtype
            return itemSubtypeToUString(itemType, itemSubtype);
        case 4: // Text
            return itemText;
        default:
            return UString();
    }
}